

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_info_hdu(fitsfile *infptr)

{
  int iVar1;
  long lVar2;
  char *__format;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  uint uVar6;
  int stat;
  int hdutype;
  int naxis;
  unsigned_long hdusum;
  unsigned_long datasum;
  int bitpix;
  char val [81];
  long naxes [9];
  char com [81];
  char msg [513];
  
  plVar3 = &DAT_0010a230;
  plVar4 = naxes;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *plVar4 = *plVar3;
    plVar3 = plVar3 + 1;
    plVar4 = plVar4 + 1;
  }
  naxis = 0;
  stat = 0;
  uVar6 = 1;
  ffmahd(infptr,1,0,&stat);
  if (stat == 0) {
    iVar1 = 0;
    while( true ) {
      if (iVar1 != 0) {
        return 0;
      }
      ffghdt(infptr,&hdutype,&stat);
      if (stat != 0) break;
      ffgkey(infptr,"XTENSION",val,com,&stat);
      if (stat == 0) {
        if (((hdutype == 0) && (iVar1 = bcmp(val + 1,"IMAGE",5), iVar1 != 0)) &&
           (iVar1 = bcmp(val + 1,"BINTABLE",5), iVar1 != 0)) {
          hdutype = 3;
        }
      }
      else {
        if (stat != 0xca) break;
        stat = 0;
      }
      ffgcks(infptr,&datasum,&hdusum,&stat);
      pcVar5 = msg;
      if (hdutype == 2) {
        __format = "  %d BINARY_TBL";
LAB_00104185:
        snprintf(msg,0x201,__format,(ulong)uVar6);
        fp_msg(msg);
        snprintf(msg,0x201," SUMS=%lu/%lu\n",~(long)(int)hdusum,datasum);
      }
      else {
        if (hdutype == 1) {
          __format = "  %d ASCII_TBL";
          goto LAB_00104185;
        }
        if (hdutype == 0) {
          snprintf(msg,0x201,"  %d IMAGE",(ulong)uVar6);
          fp_msg(msg);
          snprintf(msg,0x201," SUMS=%lu/%lu",~(long)(int)hdusum,datasum);
          fp_msg(msg);
          ffgipr(infptr,9,&bitpix,&naxis,naxes,&stat);
          snprintf(msg,0x201," BITPIX=%d",(ulong)(uint)bitpix);
          fp_msg(msg);
          if (naxis == 1) {
            snprintf(msg,0x201," [%ld]",naxes[1]);
          }
          else if (naxis == 0) {
            builtin_strncpy(msg + 8,"els]",5);
            builtin_strncpy(msg," [no_pix",8);
          }
          else {
            snprintf(msg,0x201," [%ld",naxes[0]);
            fp_msg(msg);
            for (lVar2 = 1; lVar2 < naxis; lVar2 = lVar2 + 1) {
              snprintf(msg,0x201,"x%ld",naxes[lVar2]);
              fp_msg(msg);
            }
            pcVar5 = "]";
          }
          fp_msg(pcVar5);
          iVar1 = fits_is_compressed_image(infptr,&stat);
          pcVar5 = " not_tiled\n";
          if (iVar1 != 0) {
            ffgkey(infptr,"ZCMPTYPE",val,com,&stat);
            iVar1 = bcmp(val + 1,"RICE_1",6);
            pcVar5 = " tiled_rice\n";
            if (iVar1 != 0) {
              iVar1 = bcmp(val + 1,"GZIP_1",6);
              pcVar5 = " tiled_gzip_1\n";
              if (iVar1 != 0) {
                iVar1 = bcmp(val + 1,"GZIP_2",6);
                pcVar5 = " tiled_gzip_2\n";
                if (iVar1 != 0) {
                  iVar1 = bcmp(val + 1,"PLIO_1",6);
                  pcVar5 = " tiled_plio\n";
                  if (iVar1 != 0) {
                    iVar1 = bcmp(val + 1,"HCOMPRESS_1",0xb);
                    pcVar5 = " unknown\n";
                    if (iVar1 == 0) {
                      pcVar5 = " tiled_hcompress\n";
                    }
                  }
                }
              }
            }
          }
        }
        else {
          snprintf(msg,0x201,"  %d OTHER",(ulong)uVar6);
          fp_msg(msg);
          snprintf(msg,0x201," SUMS=%lu/%lu",~(long)(int)hdusum,datasum);
          fp_msg(msg);
          snprintf(msg,0x201," %s\n",val);
        }
      }
      fp_msg(pcVar5);
      ffmrhd(infptr,1,0,&stat);
      uVar6 = uVar6 + 1;
      iVar1 = stat;
    }
  }
  fp_abort_output(infptr,(fitsfile *)0x0,stat);
}

Assistant:

int fp_info_hdu (fitsfile *infptr)
{
	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	char	msg[SZ_STR], val[SZ_CARD], com[SZ_CARD];
        int     naxis=0, hdutype, bitpix, hdupos, stat=0, ii;
        unsigned long   datasum, hdusum;

	fits_movabs_hdu (infptr, 1, NULL, &stat);
	if (stat) { 
	    fp_abort_output(infptr, NULL, stat);
	}

	for (hdupos=1; ! stat; hdupos++) {
	    fits_get_hdu_type (infptr, &hdutype, &stat);
	    if (stat) { 
	        fp_abort_output(infptr, NULL, stat);
	    }

	    /* fits_get_hdu_type calls unknown extensions "IMAGE_HDU"
	     * so consult XTENSION keyword itself
	     */
	    fits_read_keyword (infptr, "XTENSION", val, com, &stat);
	    if (stat == KEY_NO_EXIST) {
		/* in primary HDU which by definition is an "image" */
		stat=0; /* clear for later error handling */

	    } else if (stat) {
	        fp_abort_output(infptr, NULL, stat);

	    } else if (hdutype == IMAGE_HDU) {
		/* that is, if XTENSION != "IMAGE" AND != "BINTABLE" */
		if (strncmp (val+1, "IMAGE", 5) &&
		    strncmp (val+1, "BINTABLE", 5)) {

		     /* assign something other than any of these */
		    hdutype = IMAGE_HDU + ASCII_TBL + BINARY_TBL;
		}
	    }

            fits_get_chksum(infptr, &datasum, &hdusum, &stat);

	    if (hdutype == IMAGE_HDU) {
		snprintf (msg, SZ_STR,"  %d IMAGE", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

		fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, &stat);

                snprintf (msg, SZ_STR," BITPIX=%d", bitpix); fp_msg (msg);

		if (naxis == 0) {
                    snprintf (msg, SZ_STR," [no_pixels]"); fp_msg (msg);
		} else if (naxis == 1) {
		    snprintf (msg, SZ_STR," [%ld]", naxes[1]); fp_msg (msg);
		} else {
		    snprintf (msg, SZ_STR," [%ld", naxes[0]); fp_msg (msg);
		    for (ii=1; ii < naxis; ii++) {
			snprintf (msg, SZ_STR,"x%ld", naxes[ii]); fp_msg (msg);
		    }
		    fp_msg ("]");
		}

                if (fits_is_compressed_image (infptr, &stat)) {
                    fits_read_keyword (infptr, "ZCMPTYPE", val, com, &stat);

                    /* allow for quote in keyword value */
                    if (! strncmp (val+1, "RICE_1", 6))
                        fp_msg (" tiled_rice\n");
                    else if (! strncmp (val+1, "GZIP_1", 6))
                        fp_msg (" tiled_gzip_1\n");
                    else if (! strncmp (val+1, "GZIP_2", 6))
                        fp_msg (" tiled_gzip_2\n");
                    else if (! strncmp (val+1, "PLIO_1", 6))
                        fp_msg (" tiled_plio\n");
                    else if (! strncmp (val+1, "HCOMPRESS_1", 11))
                        fp_msg (" tiled_hcompress\n");
                    else
                        fp_msg (" unknown\n");

                } else
                    fp_msg (" not_tiled\n");

            } else if (hdutype == ASCII_TBL) {
                snprintf (msg, SZ_STR,"  %d ASCII_TBL", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu\n", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

            } else if (hdutype == BINARY_TBL) {
                snprintf (msg, SZ_STR,"  %d BINARY_TBL", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu\n", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

            } else {
                snprintf (msg, SZ_STR,"  %d OTHER", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu",   (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);
                snprintf (msg, SZ_STR," %s\n", val); fp_msg (msg);
            }

	    fits_movrel_hdu (infptr, 1, NULL, &stat);
	}
	return(0);
}